

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O2

void duckdb::ListAggregateFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference vec;
  BoundFunctionExpression *pBVar2;
  pointer pFVar3;
  pointer pEVar4;
  BoundAggregateExpression *pBVar5;
  FunctionLocalState *pFVar6;
  idx_t iVar7;
  Vector *this;
  ulong uVar8;
  data_ptr_t pdVar9;
  idx_t row_idx;
  idx_t iVar10;
  long *plVar11;
  idx_t child_idx;
  ulong uVar12;
  idx_t count;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2a8;
  idx_t local_2a0;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false> state_buffer;
  SelectionVector sel_vector;
  AggregateInputData aggr_input_data;
  LogicalType local_220;
  UnifiedVectorFormat lists_data;
  Vector slice;
  Vector state_vector_update;
  UnifiedVectorFormat child_data;
  StateVector state_vector;
  
  iVar10 = args->count;
  vec = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  Vector::SetVectorType(result,FLAT_VECTOR);
  FlatVector::VerifyFlatVector(result);
  if ((vec->type).id_ != SQLNULL) {
    pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                       (&state->expr->super_BaseExpression);
    pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->(&pBVar2->bind_info);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(pFVar3 + 4));
    pBVar5 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar4->super_BaseExpression);
    state_vector.count = (idx_t)state[1]._vptr_ExpressionState;
    pFVar6 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                       ((optional_ptr<duckdb::FunctionLocalState,_true> *)&state_vector);
    ArenaAllocator::Reset((ArenaAllocator *)(pFVar6 + 1));
    aggr_input_data.bind_data.ptr =
         (pBVar5->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    aggr_input_data.combine_type = PRESERVE_INPUT;
    aggr_input_data.allocator = (ArenaAllocator *)(pFVar6 + 1);
    iVar7 = ListVector::GetListSize(vec);
    this = ListVector::GetEntry(vec);
    Vector::Flatten(this,iVar7);
    UnifiedVectorFormat::UnifiedVectorFormat(&child_data);
    Vector::ToUnifiedFormat(this,iVar7,&child_data);
    UnifiedVectorFormat::UnifiedVectorFormat(&lists_data);
    Vector::ToUnifiedFormat(vec,iVar10,&lists_data);
    iVar7 = (*(pBVar5->function).state_size)(&pBVar5->function);
    state_buffer.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
         operator_new__(iVar7 * iVar10);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(pFVar3 + 4));
    (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_2a8,pEVar4);
    StateVector::StateVector
              (&state_vector,iVar10,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_2a8);
    if (local_2a8._M_head_impl != (Expression *)0x0) {
      (*((local_2a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_2a8._M_head_impl = (Expression *)0x0;
    LogicalType::LogicalType(&local_220,POINTER);
    Vector::Vector(&state_vector_update,&local_220,0x800);
    LogicalType::~LogicalType(&local_220);
    SelectionVector::SelectionVector(&sel_vector,0x800);
    count = 0;
    local_2a0 = iVar10;
    for (row_idx = 0; iVar10 = local_2a0, row_idx != local_2a0; row_idx = row_idx + 1) {
      pdVar9 = (data_ptr_t)
               (row_idx * iVar7 +
               (long)state_buffer.
                     super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      *(data_ptr_t *)(state_vector.state_vector.data + row_idx * 8) = pdVar9;
      (*(pBVar5->function).initialize)(&pBVar5->function,pdVar9);
      iVar10 = row_idx;
      if ((lists_data.sel)->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)(lists_data.sel)->sel_vector[row_idx];
      }
      if ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar10 >> 6]
           >> (iVar10 & 0x3f) & 1) != 0)) {
        plVar11 = (long *)(lists_data.data + iVar10 * 0x10);
        uVar8 = plVar11[1];
        if (uVar8 != 0) {
          for (uVar12 = 0; uVar12 < uVar8; uVar12 = uVar12 + 1) {
            if (count == 0x800) {
              Vector::Vector(&slice,this,&sel_vector,0x800);
              (*(pBVar5->function).update)(&slice,&aggr_input_data,1,&state_vector_update,0x800);
              Vector::~Vector(&slice);
              count = 0;
            }
            uVar8 = *plVar11 + uVar12;
            if ((child_data.sel)->sel_vector != (sel_t *)0x0) {
              uVar8 = (ulong)(child_data.sel)->sel_vector[uVar8];
            }
            sel_vector.sel_vector[count] = (sel_t)uVar8;
            *(data_ptr_t *)(state_vector_update.data + count * 8) = pdVar9;
            count = count + 1;
            uVar8 = plVar11[1];
          }
        }
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
    }
    if (count != 0) {
      Vector::Vector(&slice,this,&sel_vector,count);
      (*(pBVar5->function).update)(&slice,&aggr_input_data,1,&state_vector_update,count);
      Vector::~Vector(&slice);
    }
    (*(pBVar5->function).finalize)(&state_vector.state_vector,&aggr_input_data,result,iVar10,0);
    bVar1 = DataChunk::AllConstant(args);
    if (bVar1) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel_vector.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Vector::~Vector(&state_vector_update);
    StateVector::~StateVector(&state_vector);
    ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              (&state_buffer.
                super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>);
    UnifiedVectorFormat::~UnifiedVectorFormat(&lists_data);
    UnifiedVectorFormat::~UnifiedVectorFormat(&child_data);
    return;
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ListAggregateFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 2);
	ListAggregatesFunction<AggregateFunctor, true>(args, state, result);
}